

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralizedMAAStarPlannerForDecPOMDPDiscrete.cpp
# Opt level: O0

PJPDP_sharedPtr __thiscall
GeneralizedMAAStarPlannerForDecPOMDPDiscrete::ConstructExtendedJointPolicy
          (GeneralizedMAAStarPlannerForDecPOMDPDiscrete *this,
          PartialJointPolicyDiscretePure *jpolPrevTs,JointPolicyDiscretePure *jpolBG,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrOHts,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *firstOHtsI)

{
  value_type vVar1;
  PolicyDomainCategory PVar2;
  uint uVar3;
  undefined8 uVar4;
  type pPVar5;
  type this_00;
  size_t sVar6;
  ulong uVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  JointPolicyDiscrete *in_RCX;
  JointPolicyDiscrete *in_RDX;
  long *in_RSI;
  element_type *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_R8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_R9;
  undefined1 auVar10 [16];
  PJPDP_sharedPtr PVar11;
  Index ohI;
  Index type;
  Index agentI;
  PJPDP_sharedPtr *jpolTs;
  PartialJointPolicyPureVector *in_stack_ffffffffffffff58;
  PartialJointPolicyPureVector *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  E *in_stack_ffffffffffffff70;
  uint local_48;
  uint local_44;
  
  PVar2 = JointPolicyDiscrete::GetPolicyDomainCategory(in_RDX);
  if (PVar2 != OHIST_INDEX) {
    uVar4 = __cxa_allocate_exception(0x28);
    E::E(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    __cxa_throw(uVar4,&E::typeinfo,E::~E);
  }
  PVar2 = JointPolicyDiscrete::GetPolicyDomainCategory(in_RCX);
  if (PVar2 == TYPE_INDEX) {
    operator_new(0x88);
    PartialJointPolicyPureVector::PartialJointPolicyPureVector
              (in_stack_ffffffffffffff60,
               &in_stack_ffffffffffffff58->super_PartialJointPolicyDiscretePure);
    boost::shared_ptr<PartialJointPolicyDiscretePure>::shared_ptr<PartialJointPolicyPureVector>
              ((shared_ptr<PartialJointPolicyDiscretePure> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
    pPVar5 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->
                       ((shared_ptr<PartialJointPolicyDiscretePure> *)in_RDI);
    this_00 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->
                        ((shared_ptr<PartialJointPolicyDiscretePure> *)in_RDI);
    sVar6 = JointPolicy::GetDepth((JointPolicy *)this_00);
    (*(pPVar5->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
      _vptr_JointPolicy[2])(pPVar5,sVar6 + 1);
    local_44 = 0;
    while( true ) {
      uVar7 = (ulong)local_44;
      auVar10 = (**(code **)(*in_RSI + 0x30))();
      PVar11.pn.pi_ = auVar10._8_8_;
      if (auVar10._0_8_ <= uVar7) break;
      for (local_48 = 0;
          pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (in_R8,(ulong)local_44), (ulong)local_48 < *pvVar8;
          local_48 = local_48 + 1) {
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (in_R9,(ulong)local_44);
        vVar1 = *pvVar9;
        pPVar5 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->
                           ((shared_ptr<PartialJointPolicyDiscretePure> *)in_RDI);
        uVar3 = (*(in_RCX->super_JointPolicy)._vptr_JointPolicy[0x13])
                          (in_RCX,(ulong)local_44,(ulong)local_48);
        (*(pPVar5->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
          _vptr_JointPolicy[0x10])(pPVar5,(ulong)local_44,(ulong)(local_48 + vVar1),(ulong)uVar3);
      }
      local_44 = local_44 + 1;
    }
    PVar11.px = in_RDI;
    return PVar11;
  }
  uVar4 = __cxa_allocate_exception(0x28);
  E::E(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  __cxa_throw(uVar4,&E::typeinfo,E::~E);
}

Assistant:

PJPDP_sharedPtr
GeneralizedMAAStarPlannerForDecPOMDPDiscrete::ConstructExtendedJointPolicy(
        const PartialJointPolicyDiscretePure& jpolPrevTs, 
        const JointPolicyDiscretePure& jpolBG,
        const vector<size_t>& nrOHts, 
        const vector<Index>& firstOHtsI)
{
    //check policy types
    if(jpolPrevTs.GetPolicyDomainCategory() != PolicyGlobals::OHIST_INDEX)
        throw E("GeneralizedMAAStarPlannerForDecPOMDPDiscrete::ConstructExtendedJointPolicy --- jpolPrevTs.GetPolicyDomainCategory() != PolicyGlobals::OHIST_INDEX ");
    if(jpolBG.GetPolicyDomainCategory() != PolicyGlobals::TYPE_INDEX)
        throw E("GeneralizedMAAStarPlannerForDecPOMDPDiscrete::ConstructExtendedJointPolicy --- jpolPrevTs.GetPolicyDomainCategory() != PolicyGlobals::TYPE_INDEX ");
    //construct a policy for the DecPOMDP: 
    //a copy of jpolPrevTs with extended to this time step (ts) by 
    //jpolBG
    PJPDP_sharedPtr jpolTs =
        PJPDP_sharedPtr(
            new PartialJointPolicyPureVector(jpolPrevTs));
    jpolTs->SetDepth( jpolTs->GetDepth()+1 );
    for(Index agentI=0; agentI < GetNrAgents(); agentI++)
    {
        for(Index type = 0; type < nrOHts[agentI]; type++)
        {
            Index ohI = type + firstOHtsI[agentI];
            jpolTs->SetAction(agentI, ohI, 
                    jpolBG.GetActionIndex(agentI, type) );
        }         
    }
    return(jpolTs);
}